

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jaeger_types.cpp
# Opt level: O0

void __thiscall jaegertracing::thrift::Batch::printTo(Batch *this,ostream *out)

{
  ostream *poVar1;
  string local_68;
  string local_38;
  ostream *local_18;
  ostream *out_local;
  Batch *this_local;
  
  local_18 = out;
  out_local = (ostream *)this;
  std::operator<<(out,"Batch(");
  poVar1 = std::operator<<(local_18,"process=");
  apache::thrift::to_string<jaegertracing::thrift::Process>(&local_38,&this->process);
  std::operator<<(poVar1,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  poVar1 = std::operator<<(local_18,", ");
  poVar1 = std::operator<<(poVar1,"spans=");
  apache::thrift::to_string<jaegertracing::thrift::Span>(&local_68,&this->spans);
  std::operator<<(poVar1,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::operator<<(local_18,")");
  return;
}

Assistant:

void Batch::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "Batch(";
  out << "process=" << to_string(process);
  out << ", " << "spans=" << to_string(spans);
  out << ")";
}